

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall ot::commissioner::Interpreter::CancelCommand(Interpreter *this)

{
  ssize_t sVar1;
  int *piVar2;
  int cancelData;
  undefined1 local_14 [4];
  
  JobManager::CancelCommand
            ((this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  LOCK();
  (this->mCancelCommand)._M_base._M_i = true;
  UNLOCK();
  sVar1 = read(this->mCancelPipe[0],local_14,4);
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xb) {
      ::write(this->mCancelPipe[1],local_14,4);
    }
  }
  return;
}

Assistant:

void Interpreter::CancelCommand()
{
    int cancelData = 1;
    mJobManager->CancelCommand();
    // For commands being handled in place
    mCancelCommand = true;

    // reading from non-blocking pipe to empty the one prior to
    // sending cancellation signal by writing to the pipe below
    if (read(mCancelPipe[0], &cancelData, sizeof(cancelData)) == -1 && errno == EAGAIN)
    {
        cancelData = -1;
        // No data in the pipe, write is safe (no overflow)
        ssize_t result = write(mCancelPipe[1], &cancelData, sizeof(cancelData));
        (void)result;
        // writing to the pipe results in invoking mdnsCancelEventQueue()
        // lambda and respectively breaking event loop
    }
}